

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O2

error_code __thiscall
simdjson::haswell::implementation::minify
          (implementation *this,uint8_t *buf,size_t len,uint8_t *dst,size_t *dst_len)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  error_code eVar14;
  undefined1 auVar15 [32];
  undefined1 (*__dest) [16];
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  size_t sVar20;
  size_t __n;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 in_ZMM0 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  uint8_t out_block [128];
  uint8_t block [128];
  
  auVar29 = _DAT_00184480;
  uVar21 = 0;
  uVar16 = len - 0x80;
  if (len < 0x80) {
    uVar16 = uVar21;
  }
  auVar80[8] = 0x5c;
  auVar80._0_8_ = 0x5c5c5c5c5c5c5c5c;
  auVar80[9] = 0x5c;
  auVar80[10] = 0x5c;
  auVar80[0xb] = 0x5c;
  auVar80[0xc] = 0x5c;
  auVar80[0xd] = 0x5c;
  auVar80[0xe] = 0x5c;
  auVar80[0xf] = 0x5c;
  auVar80[0x10] = 0x5c;
  auVar80[0x11] = 0x5c;
  auVar80[0x12] = 0x5c;
  auVar80[0x13] = 0x5c;
  auVar80[0x14] = 0x5c;
  auVar80[0x15] = 0x5c;
  auVar80[0x16] = 0x5c;
  auVar80[0x17] = 0x5c;
  auVar80[0x18] = 0x5c;
  auVar80[0x19] = 0x5c;
  auVar80[0x1a] = 0x5c;
  auVar80[0x1b] = 0x5c;
  auVar80[0x1c] = 0x5c;
  auVar80[0x1d] = 0x5c;
  auVar80[0x1e] = 0x5c;
  auVar80[0x1f] = 0x5c;
  auVar77[8] = 0x22;
  auVar77._0_8_ = 0x2222222222222222;
  auVar77[9] = 0x22;
  auVar77[10] = 0x22;
  auVar77[0xb] = 0x22;
  auVar77[0xc] = 0x22;
  auVar77[0xd] = 0x22;
  auVar77[0xe] = 0x22;
  auVar77[0xf] = 0x22;
  auVar77[0x10] = 0x22;
  auVar77[0x11] = 0x22;
  auVar77[0x12] = 0x22;
  auVar77[0x13] = 0x22;
  auVar77[0x14] = 0x22;
  auVar77[0x15] = 0x22;
  auVar77[0x16] = 0x22;
  auVar77[0x17] = 0x22;
  auVar77[0x18] = 0x22;
  auVar77[0x19] = 0x22;
  auVar77[0x1a] = 0x22;
  auVar77[0x1b] = 0x22;
  auVar77[0x1c] = 0x22;
  auVar77[0x1d] = 0x22;
  auVar77[0x1e] = 0x22;
  auVar77[0x1f] = 0x22;
  auVar31 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar74._16_16_ = _DAT_0017f4c0;
  auVar74._0_16_ = _DAT_0017f4c0;
  uVar26 = 0;
  uVar23 = 0;
  __dest = (undefined1 (*) [16])dst;
  for (; uVar21 < uVar16; uVar21 = uVar21 + 0x80) {
    auVar32 = *(undefined1 (*) [32])(buf + uVar21);
    auVar38 = *(undefined1 (*) [32])(buf + uVar21 + 0x20);
    auVar55 = vpcmpeqb_avx2(auVar80,auVar32);
    auVar1 = vpcmpeqb_avx2(auVar80,auVar38);
    uVar17 = CONCAT44((uint)(SUB321(auVar1 >> 7,0) & 1) | (uint)(SUB321(auVar1 >> 0xf,0) & 1) << 1 |
                      (uint)(SUB321(auVar1 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar1 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar1 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar1 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar1 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar1 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar1 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar1 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar1 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar1 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar1 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar1 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar1 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar1 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar1 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar1 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar1 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar1 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar1 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar1 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar1 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar1 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar1 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar1 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar1 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar1 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar1 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar1 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar1 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar1[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar55 >> 7,0) & 1) | (uint)(SUB321(auVar55 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar55 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar55 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar55 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar55 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar55 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar55 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar55 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar55 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar55 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar55 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar55 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar55 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar55 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar55 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar55 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar55 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar55 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar55 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar55 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar55 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar55 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar55 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar55 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar55 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar55 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar55 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar55 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar55 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar55 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar55[0x1f] >> 7) << 0x1f);
    if (uVar17 == 0) {
      uVar24 = 0;
    }
    else {
      uVar17 = ~uVar23 & uVar17;
      uVar23 = uVar17 * 2 | uVar23;
      uVar27 = ~uVar23 & uVar17 & 0xaaaaaaaaaaaaaaaa;
      uVar24 = (ulong)CARRY8(uVar27,uVar17);
      uVar23 = ((uVar27 + uVar17) * 2 ^ 0x5555555555555555) & uVar23;
    }
    auVar55 = *(undefined1 (*) [32])(buf + uVar21 + 0x40);
    auVar1 = *(undefined1 (*) [32])(buf + uVar21 + 0x60);
    auVar45 = vpcmpeqb_avx2(auVar77,auVar32);
    auVar46 = vpcmpeqb_avx2(auVar77,auVar38);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = ~uVar23 & CONCAT44((uint)(SUB321(auVar46 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar46 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar46 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar46 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar46 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar46 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar46 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar46 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar46 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar46 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar46 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar46 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar46 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar46 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar46 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar46 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar46 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar46 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar46 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar46 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar46 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar46 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar46 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar46 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar46 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar46 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar46 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar46 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar46 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar46 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar46 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar46[0x1f] >> 7) << 0x1f,
                                      (uint)(SUB321(auVar45 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar45 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar45 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar45 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar45 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar45 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar45 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar45 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar45 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar45 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar45 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar45 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar45 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar45 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar45 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar45 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar45 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar45 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar45 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar45 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar45 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar45 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar45 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar45 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar45 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar45 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar45 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar45 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar45 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar45 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar45 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar45[0x1f] >> 7) << 0x1f);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar31._0_8_;
    auVar30 = (undefined1  [16])0x0;
    for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
      if ((auVar5 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
        auVar30 = auVar30 ^ auVar9 << uVar4;
      }
    }
    auVar45 = vpshufb_avx2(auVar74,auVar32);
    auVar46 = vpshufb_avx2(auVar74,auVar38);
    auVar45 = vpcmpeqb_avx2(auVar32,auVar45);
    auVar46 = vpcmpeqb_avx2(auVar38,auVar46);
    auVar2 = vpcmpeqb_avx2(auVar80,auVar55);
    auVar3 = vpcmpeqb_avx2(auVar80,auVar1);
    uVar23 = CONCAT44((uint)(SUB321(auVar3 >> 7,0) & 1) | (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
                      (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                      (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      uVar17 = ~uVar24 & uVar23;
      uVar24 = uVar24 + uVar17 * 2;
      uVar27 = ~uVar24 & uVar23 & 0xaaaaaaaaaaaaaaaa;
      uVar23 = (ulong)CARRY8(uVar27,uVar17);
      uVar24 = ((uVar27 + uVar17) * 2 ^ 0x5555555555555555) & uVar24;
    }
    uVar26 = auVar30._0_8_ ^ uVar26;
    auVar2 = vpcmpeqb_avx2(auVar77,auVar55);
    auVar3 = vpcmpeqb_avx2(auVar77,auVar1);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = ~uVar24 & CONCAT44((uint)(SUB321(auVar3 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f,
                                      (uint)(SUB321(auVar2 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar31._0_8_;
    auVar30 = (undefined1  [16])0x0;
    for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
      if ((auVar6 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
        auVar30 = auVar30 ^ auVar10 << uVar4;
      }
    }
    uVar24 = auVar30._0_8_ ^ (long)uVar26 >> 0x3f;
    auVar2 = vpshufb_avx2(auVar74,auVar55);
    auVar3 = vpshufb_avx2(auVar74,auVar1);
    auVar2 = vpcmpeqb_avx2(auVar2,auVar55);
    auVar3 = vpcmpeqb_avx2(auVar3,auVar1);
    uVar17 = ~uVar26 & CONCAT44((uint)(SUB321(auVar46 >> 7,0) & 1) |
                                (uint)(SUB321(auVar46 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar46 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar46 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar46 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar46 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar46 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar46 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar46 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar46 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar46 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar46 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar46 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar46 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar46 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar46 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar46 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar46 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar46 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar46 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar46 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar46 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar46 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar46 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar46 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar46 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar46 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar46 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar46 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar46 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar46 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar46[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar45 >> 7,0) & 1) |
                                (uint)(SUB321(auVar45 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar45 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar45 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar45 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar45 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar45 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar45 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar45 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar45 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar45 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar45 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar45 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar45 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar45 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar45 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar45 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar45 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar45 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar45 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar45 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar45 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar45 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar45 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar45 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar45 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar45 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar45 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar45 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar45 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar45 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar45[0x1f] >> 7) << 0x1f);
    uVar26 = (ulong)((uint)(uVar17 >> 0x10) & 0xff);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar17 >> 0x18 & 0xff) * 8);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar26 * 8);
    auVar30 = vpunpcklqdq_avx(auVar57,auVar48);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar17 >> 8) & 0xff) * 8);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar17 & 0xff) * 8);
    auVar5 = vpunpcklqdq_avx(auVar63,auVar58);
    auVar52._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar5;
    auVar52._16_16_ = ZEXT116(1) * auVar30;
    auVar45 = vpaddb_avx2(auVar29,auVar52);
    auVar32 = vpshufb_avx2(auVar32,auVar45);
    auVar53._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar17 & 0xff] * 8);
    auVar53._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8);
    auVar32 = vpshufb_avx2(auVar32,auVar53);
    *__dest = auVar32._0_16_;
    uVar22 = POPCOUNT((uint)uVar17);
    *(undefined1 (*) [16])((long)__dest + (0x10 - (ulong)(uint)POPCOUNT((uint)uVar17 & 0xffff))) =
         auVar32._16_16_;
    uVar26 = uVar17 >> 0x30 & 0xff;
    uVar4 = (uint)(uVar17 >> 0x20);
    uVar27 = uVar17 >> 0x20 & 0xff;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar17 >> 0x38) * 8);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar26 * 8);
    auVar30 = vpunpcklqdq_avx(auVar49,auVar40);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar4 >> 8 & 0xff) * 8);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
    auVar5 = vpunpcklqdq_avx(auVar64,auVar59);
    auVar45._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar5;
    auVar45._16_16_ = ZEXT116(1) * auVar30;
    auVar32 = vpaddb_avx2(auVar29,auVar45);
    auVar54._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
    auVar54._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8);
    auVar32 = vpshufb_avx2(auVar38,auVar32);
    auVar32 = vpshufb_avx2(auVar32,auVar54);
    *(undefined1 (*) [16])((long)__dest + (0x20 - (ulong)uVar22)) = auVar32._0_16_;
    *(undefined1 (*) [16])
     ((long)__dest + (-(ulong)(uint)POPCOUNT(uVar4 & 0xffff) - (ulong)uVar22) + 0x30) =
         auVar32._16_16_;
    lVar18 = POPCOUNT(~uVar17);
    uVar27 = ~uVar24 & CONCAT44((uint)(SUB321(auVar3 >> 7,0) & 1) |
                                (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar2 >> 7,0) & 1) |
                                (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
    uVar26 = (ulong)((uint)(uVar27 >> 0x10) & 0xff);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar27 >> 0x18 & 0xff) * 8);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar26 * 8);
    auVar30 = vpunpcklqdq_avx(auVar60,auVar34);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar27 >> 8) & 0xff) * 8);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar27 & 0xff) * 8);
    auVar5 = vpunpcklqdq_avx(auVar50,auVar41);
    auVar38._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar5;
    auVar38._16_16_ = ZEXT116(1) * auVar30;
    auVar32 = vpaddb_avx2(auVar29,auVar38);
    auVar46._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar27 & 0xff] * 8);
    auVar46._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8);
    auVar32 = vpshufb_avx2(auVar55,auVar32);
    auVar32 = vpshufb_avx2(auVar32,auVar46);
    *(undefined1 (*) [16])(*__dest + lVar18) = auVar32._0_16_;
    *(undefined1 (*) [16])
     ((long)__dest + (lVar18 - (ulong)(uint)POPCOUNT((uint)uVar27 & 0xffff)) + 0x10) =
         auVar32._16_16_;
    lVar13 = lVar18 - (ulong)(uint)POPCOUNT((uint)uVar27);
    uVar26 = uVar27 >> 0x30 & 0xff;
    uVar4 = (uint)(uVar27 >> 0x20);
    uVar17 = uVar27 >> 0x20 & 0xff;
    auVar55._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar17] * 8
            );
    auVar55._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar27 >> 0x38) * 8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar26 * 8);
    auVar30 = vpunpcklqdq_avx(auVar35,auVar30);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar4 >> 8 & 0xff) * 8);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar17 * 8);
    auVar5 = vpunpcklqdq_avx(auVar61,auVar42);
    auVar32._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar5;
    auVar32._16_16_ = ZEXT116(1) * auVar30;
    auVar32 = vpaddb_avx2(auVar29,auVar32);
    auVar32 = vpshufb_avx2(auVar1,auVar32);
    auVar32 = vpshufb_avx2(auVar32,auVar55);
    *(undefined1 (*) [16])((long)__dest + lVar13 + 0x20) = auVar32._0_16_;
    *(undefined1 (*) [16])((long)__dest + (lVar13 - (ulong)(uint)POPCOUNT(uVar4 & 0xffff)) + 0x30) =
         auVar32._16_16_;
    uVar26 = (long)uVar24 >> 0x3f;
    __dest = (undefined1 (*) [16])(*__dest + POPCOUNT(~uVar27) + lVar18);
  }
  __n = len - uVar21;
  if (__n != 0) {
    builtin_memcpy(block,
                   "                                                                                                                                "
                   ,0x80);
    memcpy(block,buf + uVar21,__n);
    auVar1[1] = block[1];
    auVar1[0] = block[0];
    auVar1[2] = block[2];
    auVar1[3] = block[3];
    auVar1[4] = block[4];
    auVar1[5] = block[5];
    auVar1[6] = block[6];
    auVar1[7] = block[7];
    auVar1[8] = block[8];
    auVar1[9] = block[9];
    auVar1[10] = block[10];
    auVar1[0xb] = block[0xb];
    auVar1[0xc] = block[0xc];
    auVar1[0xd] = block[0xd];
    auVar1[0xe] = block[0xe];
    auVar1[0xf] = block[0xf];
    auVar1[0x10] = block[0x10];
    auVar1[0x11] = block[0x11];
    auVar1[0x12] = block[0x12];
    auVar1[0x13] = block[0x13];
    auVar1[0x14] = block[0x14];
    auVar1[0x15] = block[0x15];
    auVar1[0x16] = block[0x16];
    auVar1[0x17] = block[0x17];
    auVar1[0x18] = block[0x18];
    auVar1[0x19] = block[0x19];
    auVar1[0x1a] = block[0x1a];
    auVar1[0x1b] = block[0x1b];
    auVar1[0x1c] = block[0x1c];
    auVar1[0x1d] = block[0x1d];
    auVar1[0x1e] = block[0x1e];
    auVar1[0x1f] = block[0x1f];
    auVar2[1] = block[0x21];
    auVar2[0] = block[0x20];
    auVar2[2] = block[0x22];
    auVar2[3] = block[0x23];
    auVar2[4] = block[0x24];
    auVar2[5] = block[0x25];
    auVar2[6] = block[0x26];
    auVar2[7] = block[0x27];
    auVar2[8] = block[0x28];
    auVar2[9] = block[0x29];
    auVar2[10] = block[0x2a];
    auVar2[0xb] = block[0x2b];
    auVar2[0xc] = block[0x2c];
    auVar2[0xd] = block[0x2d];
    auVar2[0xe] = block[0x2e];
    auVar2[0xf] = block[0x2f];
    auVar2[0x10] = block[0x30];
    auVar2[0x11] = block[0x31];
    auVar2[0x12] = block[0x32];
    auVar2[0x13] = block[0x33];
    auVar2[0x14] = block[0x34];
    auVar2[0x15] = block[0x35];
    auVar2[0x16] = block[0x36];
    auVar2[0x17] = block[0x37];
    auVar2[0x18] = block[0x38];
    auVar2[0x19] = block[0x39];
    auVar2[0x1a] = block[0x3a];
    auVar2[0x1b] = block[0x3b];
    auVar2[0x1c] = block[0x3c];
    auVar2[0x1d] = block[0x3d];
    auVar2[0x1e] = block[0x3e];
    auVar2[0x1f] = block[0x3f];
    auVar3[1] = block[0x41];
    auVar3[0] = block[0x40];
    auVar3[2] = block[0x42];
    auVar3[3] = block[0x43];
    auVar3[4] = block[0x44];
    auVar3[5] = block[0x45];
    auVar3[6] = block[0x46];
    auVar3[7] = block[0x47];
    auVar3[8] = block[0x48];
    auVar3[9] = block[0x49];
    auVar3[10] = block[0x4a];
    auVar3[0xb] = block[0x4b];
    auVar3[0xc] = block[0x4c];
    auVar3[0xd] = block[0x4d];
    auVar3[0xe] = block[0x4e];
    auVar3[0xf] = block[0x4f];
    auVar3[0x10] = block[0x50];
    auVar3[0x11] = block[0x51];
    auVar3[0x12] = block[0x52];
    auVar3[0x13] = block[0x53];
    auVar3[0x14] = block[0x54];
    auVar3[0x15] = block[0x55];
    auVar3[0x16] = block[0x56];
    auVar3[0x17] = block[0x57];
    auVar3[0x18] = block[0x58];
    auVar3[0x19] = block[0x59];
    auVar3[0x1a] = block[0x5a];
    auVar3[0x1b] = block[0x5b];
    auVar3[0x1c] = block[0x5c];
    auVar3[0x1d] = block[0x5d];
    auVar3[0x1e] = block[0x5e];
    auVar3[0x1f] = block[0x5f];
    auVar15[1] = block[0x61];
    auVar15[0] = block[0x60];
    auVar15[2] = block[0x62];
    auVar15[3] = block[99];
    auVar15[4] = block[100];
    auVar15[5] = block[0x65];
    auVar15[6] = block[0x66];
    auVar15[7] = block[0x67];
    auVar15[8] = block[0x68];
    auVar15[9] = block[0x69];
    auVar15[10] = block[0x6a];
    auVar15[0xb] = block[0x6b];
    auVar15[0xc] = block[0x6c];
    auVar15[0xd] = block[0x6d];
    auVar15[0xe] = block[0x6e];
    auVar15[0xf] = block[0x6f];
    auVar15[0x10] = block[0x70];
    auVar15[0x11] = block[0x71];
    auVar15[0x12] = block[0x72];
    auVar15[0x13] = block[0x73];
    auVar15[0x14] = block[0x74];
    auVar15[0x15] = block[0x75];
    auVar15[0x16] = block[0x76];
    auVar15[0x17] = block[0x77];
    auVar15[0x18] = block[0x78];
    auVar15[0x19] = block[0x79];
    auVar15[0x1a] = block[0x7a];
    auVar15[0x1b] = block[0x7b];
    auVar15[0x1c] = block[0x7c];
    auVar15[0x1d] = block[0x7d];
    auVar15[0x1e] = block[0x7e];
    auVar15[0x1f] = block[0x7f];
    auVar29 = vpcmpeqb_avx2(auVar80,auVar1);
    auVar74 = vpcmpeqb_avx2(auVar80,auVar2);
    uVar16 = CONCAT44((uint)(SUB321(auVar74 >> 7,0) & 1) | (uint)(SUB321(auVar74 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar74 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar74 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar74 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar74 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar74 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar74 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar74 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar74 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar74 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar74 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar74 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar74 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar74 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar74 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar74 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar74 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar74 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar74 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar74 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar74 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar74 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar74 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar74 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar74 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar74 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar74 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar74 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar74 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar74 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar74[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar29 >> 7,0) & 1) | (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    if (uVar16 == 0) {
      uVar21 = 0;
    }
    else {
      uVar16 = ~uVar23 & uVar16;
      uVar23 = uVar16 * 2 | uVar23;
      uVar17 = ~uVar23 & uVar16 & 0xaaaaaaaaaaaaaaaa;
      uVar21 = (ulong)CARRY8(uVar17,uVar16);
      uVar23 = ((uVar17 + uVar16) * 2 ^ 0x5555555555555555) & uVar23;
    }
    auVar65._16_16_ = _DAT_0017f4c0;
    auVar65._0_16_ = _DAT_0017f4c0;
    auVar29 = vpcmpeqb_avx2(auVar77,auVar1);
    auVar74 = vpcmpeqb_avx2(auVar77,auVar2);
    auVar31 = vpcmpeqd_avx(auVar74._0_16_,auVar74._0_16_);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = ~uVar23 & CONCAT44((uint)(SUB321(auVar74 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar74 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar74 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar74 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar74 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar74 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar74 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar74 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar74 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar74 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar74 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar74 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar74 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar74 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar74 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar74 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar74 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar74 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar74 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar74 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar74 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar74 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar74 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar74 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar74 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar74 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar74 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar74 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar74 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar74 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar74 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar74[0x1f] >> 7) << 0x1f,
                                      (uint)(SUB321(auVar29 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar31._0_8_;
    auVar30 = (undefined1  [16])0x0;
    for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
        auVar30 = auVar30 ^ auVar11 << uVar4;
      }
    }
    uVar26 = auVar30._0_8_ ^ uVar26;
    auVar29 = vpshufb_avx2(auVar65,auVar1);
    auVar74 = vpshufb_avx2(auVar65,auVar2);
    auVar29 = vpcmpeqb_avx2(auVar1,auVar29);
    auVar74 = vpcmpeqb_avx2(auVar2,auVar74);
    auVar32 = vpcmpeqb_avx2(auVar80,auVar3);
    auVar80 = vpcmpeqb_avx2(auVar80,auVar15);
    uVar16 = CONCAT44((uint)(SUB321(auVar80 >> 7,0) & 1) | (uint)(SUB321(auVar80 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar80 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar80 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar80 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar80 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar80 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar80 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar80 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar80 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar80 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar80 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar80 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar80 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar80 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar80 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar80 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar80 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar80 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar80 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar80 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar80 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar80 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar80 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar80 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar80 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar80 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar80 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar80 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar80 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar80 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar80[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar32 >> 7,0) & 1) | (uint)(SUB321(auVar32 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar32 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar32 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar32 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar32 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar32 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar32 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar32 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar32 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar32 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar32 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar32 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar32 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar32 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar32 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar32 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar32 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar32 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar32 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar32 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar32 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar32 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar32 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar32 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar32 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar32 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar32 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar32 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar32 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar32 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar32[0x1f] >> 7) << 0x1f);
    if (uVar16 != 0) {
      uVar23 = ~uVar21 & uVar16;
      uVar21 = (((~(uVar23 * 2) & uVar16 & 0x2aaaaaaaaaaaaaaa) + uVar23) * 2 ^ 0x5555555555555555) &
               uVar21 + uVar23 * 2;
    }
    auVar80 = vpcmpeqb_avx2(auVar77,auVar3);
    auVar77 = vpcmpeqb_avx2(auVar77,auVar15);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = ~uVar21 & CONCAT44((uint)(SUB321(auVar77 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar77 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar77 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar77 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar77 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar77 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar77 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar77 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar77 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar77 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar77 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar77 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar77 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar77 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar77 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar77 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar77 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar77 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar77 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar77 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar77 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar77 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar77 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar77 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar77 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar77 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar77 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar77 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar77 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar77 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar77 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar77[0x1f] >> 7) << 0x1f,
                                      (uint)(SUB321(auVar80 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar80 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar80 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar80 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar80 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar80 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar80 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar80 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar80 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar80 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar80 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar80 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar80 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar80 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar80 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar80 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar80 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar80 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar80 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar80 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar80 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar80 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar80 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar80 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar80 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar80 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar80 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar80 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar80 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar80 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar80 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar80[0x1f] >> 7) << 0x1f);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = auVar31._0_8_;
    auVar31 = (undefined1  [16])0x0;
    for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
      if ((auVar8 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
        auVar31 = auVar31 ^ auVar12 << uVar4;
      }
    }
    uVar24 = auVar31._0_8_ ^ (long)uVar26 >> 0x3f;
    auVar77 = vpshufb_avx2(auVar65,auVar3);
    auVar80 = vpshufb_avx2(auVar65,auVar15);
    auVar77 = vpcmpeqb_avx2(auVar3,auVar77);
    auVar80 = vpcmpeqb_avx2(auVar15,auVar80);
    uVar27 = ~uVar26 & CONCAT44((uint)(SUB321(auVar74 >> 7,0) & 1) |
                                (uint)(SUB321(auVar74 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar74 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar74 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar74 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar74 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar74 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar74 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar74 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar74 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar74 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar74 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar74 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar74 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar74 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar74 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar74 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar74 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar74 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar74 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar74 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar74 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar74 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar74 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar74 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar74 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar74 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar74 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar74 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar74 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar74 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar74[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar29 >> 7,0) & 1) |
                                (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    uVar16 = (ulong)((uint)(uVar27 >> 0x10) & 0xff);
    auVar47._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar16] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar27 & 0xff] * 8);
    auVar47._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar16] * 8);
    uVar23 = uVar27 >> 0x30 & 0xff;
    uVar26 = uVar27 >> 0x20 & 0xff;
    auVar56._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar23] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar26] * 8
            );
    auVar56._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar23] * 8);
    uVar25 = ~uVar24 & CONCAT44((uint)(SUB321(auVar80 >> 7,0) & 1) |
                                (uint)(SUB321(auVar80 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar80 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar80 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar80 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar80 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar80 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar80 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar80 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar80 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar80 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar80 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar80 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar80 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar80 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar80 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar80 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar80 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar80 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar80 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar80 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar80 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar80 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar80 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar80 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar80 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar80 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar80 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar80 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar80 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar80 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar80[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar77 >> 7,0) & 1) |
                                (uint)(SUB321(auVar77 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar77 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar77 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar77 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar77 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar77 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar77 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar77 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar77 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar77 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar77 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar77 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar77 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar77 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar77 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar77 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar77 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar77 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar77 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar77 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar77 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar77 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar77 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar77 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar77 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar77 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar77 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar77 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar77 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar77 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar77[0x1f] >> 7) << 0x1f);
    uVar17 = (ulong)((uint)(uVar25 >> 0x10) & 0xff);
    auVar62._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar17] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar25 & 0xff] * 8);
    auVar62._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar17] * 8);
    uVar21 = uVar25 >> 0x30 & 0xff;
    uVar28 = uVar25 >> 0x20 & 0xff;
    auVar66._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar21] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar28] * 8
            );
    auVar66._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar21] * 8);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar27 >> 0x18 & 0xff) * 8);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar16 * 8);
    auVar31 = vpunpcklqdq_avx(auVar71,auVar67);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar27 >> 8) & 0xff) * 8);
    auVar78._8_8_ = 0;
    auVar78._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar27 & 0xff) * 8);
    auVar30 = vpunpcklqdq_avx(auVar78,auVar75);
    auVar70._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar30;
    auVar70._16_16_ = ZEXT116(1) * auVar31;
    auVar29 = vpaddb_avx2(auVar70,_DAT_00184480);
    auVar29 = vpshufb_avx2(auVar1,auVar29);
    auVar29 = vpshufb_avx2(auVar29,auVar47);
    out_block._0_16_ = auVar29._0_16_;
    *(undefined1 (*) [16])(out_block + (0x10 - (ulong)(uint)POPCOUNT((uint)uVar27 & 0xffff))) =
         auVar29._16_16_;
    lVar13 = -(ulong)(uint)POPCOUNT((uint)uVar27);
    uVar4 = (uint)(uVar27 >> 0x20);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar27 >> 0x38) * 8);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar23 * 8);
    auVar31 = vpunpcklqdq_avx(auVar43,auVar36);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar4 >> 8 & 0xff) * 8);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar26 * 8);
    auVar30 = vpunpcklqdq_avx(auVar72,auVar68);
    auVar39._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar30;
    auVar39._16_16_ = ZEXT116(1) * auVar31;
    auVar29 = vpaddb_avx2(_DAT_00184480,auVar39);
    auVar29 = vpshufb_avx2(auVar2,auVar29);
    auVar29 = vpshufb_avx2(auVar29,auVar56);
    *(undefined1 (*) [16])(out_block + lVar13 + 0x20) = auVar29._0_16_;
    *(undefined1 (*) [16])(out_block + (lVar13 - (ulong)(uint)POPCOUNT(uVar4 & 0xffff)) + 0x30) =
         auVar29._16_16_;
    uVar4 = (uint)(uVar25 >> 0x20);
    uVar16 = *(ulong *)(internal::thintable_epi8 + (uVar25 >> 0x38) * 8);
    uVar21 = *(ulong *)(internal::thintable_epi8 + uVar21 * 8);
    uVar26 = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar4 >> 8 & 0xff) * 8);
    pauVar19 = (undefined1 (*) [16])(out_block + POPCOUNT(~uVar27));
    uVar23 = *(ulong *)(internal::thintable_epi8 + uVar28 * 8);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar25 >> 0x18 & 0xff) * 8);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar17 * 8);
    auVar31 = vpunpcklqdq_avx(auVar37,auVar31);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar25 >> 8) & 0xff) * 8);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar25 & 0xff) * 8);
    auVar30 = vpunpcklqdq_avx(auVar51,auVar44);
    auVar33._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar30;
    auVar33._16_16_ = ZEXT116(1) * auVar31;
    auVar29 = vpaddb_avx2(_DAT_00184480,auVar33);
    auVar29 = vpshufb_avx2(auVar3,auVar29);
    auVar29 = vpshufb_avx2(auVar29,auVar62);
    *pauVar19 = auVar29._0_16_;
    *(undefined1 (*) [16])((long)pauVar19 + (0x10 - (ulong)(uint)POPCOUNT((uint)uVar25 & 0xffff))) =
         auVar29._16_16_;
    uVar22 = POPCOUNT((uint)uVar25);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar16;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar21;
    auVar31 = vpunpcklqdq_avx(auVar73,auVar69);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar26;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar23;
    auVar30 = vpunpcklqdq_avx(auVar79,auVar76);
    auVar29._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar30;
    auVar29._16_16_ = ZEXT116(1) * auVar31;
    auVar29 = vpaddb_avx2(_DAT_00184480,auVar29);
    auVar29 = vpshufb_avx2(auVar15,auVar29);
    auVar29 = vpshufb_avx2(auVar29,auVar66);
    *(undefined1 (*) [16])((long)pauVar19 + (0x20 - (ulong)uVar22)) = auVar29._0_16_;
    *(undefined1 (*) [16])
     ((long)pauVar19 + (-(ulong)(uint)POPCOUNT(uVar4 & 0xffff) - (ulong)uVar22) + 0x30) =
         auVar29._16_16_;
    uVar16 = POPCOUNT(~uVar25) + POPCOUNT(~uVar27);
    uVar26 = (long)uVar24 >> 0x3f;
    if (__n <= uVar16) {
      uVar16 = __n;
    }
    memcpy(__dest,out_block,uVar16);
    __dest = (undefined1 (*) [16])(*__dest + uVar16);
  }
  sVar20 = 0;
  eVar14 = UNCLOSED_STRING;
  if (uVar26 == 0) {
    sVar20 = (long)__dest - (long)dst;
    eVar14 = SUCCESS;
  }
  *dst_len = sVar20;
  return eVar14;
}

Assistant:

simdjson_warn_unused error_code implementation::minify(const uint8_t *buf, size_t len, uint8_t *dst, size_t &dst_len) const noexcept {
  return haswell::stage1::json_minifier::minify<128>(buf, len, dst, dst_len);
}